

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvtBroadphase.cpp
# Opt level: O2

void __thiscall btDbvtBroadphase::collide(btDbvtBroadphase *this,btDispatcher *dispatcher)

{
  uint uVar1;
  btDbvtProxy *pbVar2;
  btDbvtProxy *pbVar3;
  long lVar4;
  byte bVar5;
  bool bVar6;
  btDbvtNode *pbVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  undefined1 *this_00;
  btDbvtProxy *item;
  int i;
  btScalar bVar12;
  btDbvtVolume curAabb;
  undefined4 extraout_var;
  
  this_00 = &this->field_0x8;
  btDbvt::optimizeIncremental
            ((btDbvt *)this_00,(this->m_dupdates * *(int *)&this->field_0x1c) / 100 + 1);
  if (this->m_fixedleft != 0) {
    iVar11 = (this->m_fupdates * *(int *)&this->field_0x7c) / 100 + 1;
    btDbvt::optimizeIncremental((btDbvt *)&this->field_0x68,iVar11);
    iVar11 = this->m_fixedleft - iVar11;
    iVar10 = 0;
    if (0 < iVar11) {
      iVar10 = iVar11;
    }
    this->m_fixedleft = iVar10;
  }
  iVar10 = (this->m_stageCurrent + 1) % 2;
  this->m_stageCurrent = iVar10;
  if (this->m_stageRoots[iVar10] != (btDbvtProxy *)0x0) {
    item = this->m_stageRoots[iVar10];
    do {
      pbVar2 = item->links[1];
      listremove<btDbvtProxy>(item,this->m_stageRoots + item->stage);
      item->links[0] = (btDbvtProxy *)0x0;
      pbVar3 = this->m_stageRoots[2];
      item->links[1] = pbVar3;
      if (pbVar3 != (btDbvtProxy *)0x0) {
        pbVar3->links[0] = item;
      }
      this->m_stageRoots[2] = item;
      btDbvt::remove((btDbvt *)this_00,(char *)item->leaf);
      curAabb.mi.m_floats._0_8_ = *(undefined8 *)(item->super_btBroadphaseProxy).m_aabbMin.m_floats;
      curAabb.mi.m_floats._8_8_ =
           *(undefined8 *)((item->super_btBroadphaseProxy).m_aabbMin.m_floats + 2);
      curAabb.mx.m_floats._0_8_ = *(undefined8 *)(item->super_btBroadphaseProxy).m_aabbMax.m_floats;
      curAabb.mx.m_floats._8_8_ =
           *(undefined8 *)((item->super_btBroadphaseProxy).m_aabbMax.m_floats + 2);
      pbVar7 = btDbvt::insert((btDbvt *)&this->field_0x68,&curAabb,item);
      item->leaf = pbVar7;
      item->stage = 2;
      item = pbVar2;
    } while (pbVar2 != (btDbvtProxy *)0x0);
    this->m_fixedleft = *(int *)&this->field_0x7c;
    this->m_needcleanup = true;
  }
  curAabb.mi.m_floats._0_8_ = &PTR__ICollide_001ec108;
  bVar5 = this->m_deferedcollide;
  curAabb.mi.m_floats._8_8_ = this;
  if ((bool)bVar5 == true) {
    btDbvt::collideTTpersistentStack
              ((btDbvt *)this_00,*(btDbvtNode **)&this->field_0x8,*(btDbvtNode **)&this->field_0x68,
               (ICollide *)&curAabb);
    bVar5 = this->m_deferedcollide;
  }
  if ((bVar5 & 1) != 0) {
    btDbvt::collideTTpersistentStack
              ((btDbvt *)this_00,*(btDbvtNode **)this_00,*(btDbvtNode **)this_00,
               (ICollide *)&curAabb);
  }
  if (this->m_needcleanup == true) {
    iVar10 = (*(this->m_paircache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback
               [7])();
    lVar8 = CONCAT44(extraout_var,iVar10);
    iVar10 = *(int *)(lVar8 + 4);
    if (0 < iVar10) {
      iVar11 = (this->m_cupdates * iVar10) / 100;
      if (iVar11 < this->m_newpairs) {
        iVar11 = this->m_newpairs;
      }
      if (iVar10 < iVar11) {
        iVar11 = iVar10;
      }
      for (iVar10 = 0; iVar10 < iVar11; iVar10 = iVar10 + 1) {
        lVar9 = (long)((this->m_cid + iVar10) % *(int *)(lVar8 + 4)) * 0x20;
        lVar4 = *(long *)(*(long *)(lVar8 + 0x10) + lVar9);
        lVar9 = *(long *)(*(long *)(lVar8 + 0x10) + 8 + lVar9);
        bVar6 = Intersect(*(btDbvtAabbMm **)(lVar4 + 0x40),*(btDbvtAabbMm **)(lVar9 + 0x40));
        if (!bVar6) {
          (*(this->m_paircache->super_btOverlappingPairCallback)._vptr_btOverlappingPairCallback[3])
                    (this->m_paircache,lVar4,lVar9,dispatcher);
          iVar11 = iVar11 + -1;
          iVar10 = iVar10 + -1;
        }
      }
      if (*(int *)(lVar8 + 4) < 1) {
        iVar10 = 0;
      }
      else {
        iVar10 = (iVar11 + this->m_cid) % *(int *)(lVar8 + 4);
      }
      this->m_cid = iVar10;
    }
  }
  this->m_pid = this->m_pid + 1;
  this->m_newpairs = 1;
  this->m_needcleanup = false;
  uVar1 = this->m_updates_call;
  bVar12 = 0.0;
  if (uVar1 != 0) {
    bVar12 = (float)this->m_updates_done / (float)uVar1;
  }
  this->m_updates_ratio = bVar12;
  this->m_updates_done = this->m_updates_done >> 1;
  this->m_updates_call = uVar1 >> 1;
  return;
}

Assistant:

void							btDbvtBroadphase::collide(btDispatcher* dispatcher)
{
	/*printf("---------------------------------------------------------\n");
	printf("m_sets[0].m_leaves=%d\n",m_sets[0].m_leaves);
	printf("m_sets[1].m_leaves=%d\n",m_sets[1].m_leaves);
	printf("numPairs = %d\n",getOverlappingPairCache()->getNumOverlappingPairs());
	{
		int i;
		for (i=0;i<getOverlappingPairCache()->getNumOverlappingPairs();i++)
		{
			printf("pair[%d]=(%d,%d),",i,getOverlappingPairCache()->getOverlappingPairArray()[i].m_pProxy0->getUid(),
				getOverlappingPairCache()->getOverlappingPairArray()[i].m_pProxy1->getUid());
		}
		printf("\n");
	}
*/



	SPC(m_profiling.m_total);
	/* optimize				*/ 
	m_sets[0].optimizeIncremental(1+(m_sets[0].m_leaves*m_dupdates)/100);
	if(m_fixedleft)
	{
		const int count=1+(m_sets[1].m_leaves*m_fupdates)/100;
		m_sets[1].optimizeIncremental(1+(m_sets[1].m_leaves*m_fupdates)/100);
		m_fixedleft=btMax<int>(0,m_fixedleft-count);
	}
	/* dynamic -> fixed set	*/ 
	m_stageCurrent=(m_stageCurrent+1)%STAGECOUNT;
	btDbvtProxy*	current=m_stageRoots[m_stageCurrent];
	if(current)
	{
		btDbvtTreeCollider	collider(this);
		do	{
			btDbvtProxy*	next=current->links[1];
			listremove(current,m_stageRoots[current->stage]);
			listappend(current,m_stageRoots[STAGECOUNT]);
#if DBVT_BP_ACCURATESLEEPING
			m_paircache->removeOverlappingPairsContainingProxy(current,dispatcher);
			collider.proxy=current;
			btDbvt::collideTV(m_sets[0].m_root,current->aabb,collider);
			btDbvt::collideTV(m_sets[1].m_root,current->aabb,collider);
#endif
			m_sets[0].remove(current->leaf);
			ATTRIBUTE_ALIGNED16(btDbvtVolume)	curAabb=btDbvtVolume::FromMM(current->m_aabbMin,current->m_aabbMax);
			current->leaf	=	m_sets[1].insert(curAabb,current);
			current->stage	=	STAGECOUNT;	
			current			=	next;
		} while(current);
		m_fixedleft=m_sets[1].m_leaves;
		m_needcleanup=true;
	}
	/* collide dynamics		*/ 
	{
		btDbvtTreeCollider	collider(this);
		if(m_deferedcollide)
		{
			SPC(m_profiling.m_fdcollide);
			m_sets[0].collideTTpersistentStack(m_sets[0].m_root,m_sets[1].m_root,collider);
		}
		if(m_deferedcollide)
		{
			SPC(m_profiling.m_ddcollide);
			m_sets[0].collideTTpersistentStack(m_sets[0].m_root,m_sets[0].m_root,collider);
		}
	}
	/* clean up				*/ 
	if(m_needcleanup)
	{
		SPC(m_profiling.m_cleanup);
		btBroadphasePairArray&	pairs=m_paircache->getOverlappingPairArray();
		if(pairs.size()>0)
		{

			int			ni=btMin(pairs.size(),btMax<int>(m_newpairs,(pairs.size()*m_cupdates)/100));
			for(int i=0;i<ni;++i)
			{
				btBroadphasePair&	p=pairs[(m_cid+i)%pairs.size()];
				btDbvtProxy*		pa=(btDbvtProxy*)p.m_pProxy0;
				btDbvtProxy*		pb=(btDbvtProxy*)p.m_pProxy1;
				if(!Intersect(pa->leaf->volume,pb->leaf->volume))
				{
#if DBVT_BP_SORTPAIRS
					if(pa->m_uniqueId>pb->m_uniqueId) 
						btSwap(pa,pb);
#endif
					m_paircache->removeOverlappingPair(pa,pb,dispatcher);
					--ni;--i;
				}
			}
			if(pairs.size()>0) m_cid=(m_cid+ni)%pairs.size(); else m_cid=0;
		}
	}
	++m_pid;
	m_newpairs=1;
	m_needcleanup=false;
	if(m_updates_call>0)
	{ m_updates_ratio=m_updates_done/(btScalar)m_updates_call; }
	else
	{ m_updates_ratio=0; }
	m_updates_done/=2;
	m_updates_call/=2;
}